

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IndexFlush(Fts5Index *p)

{
  Fts5Index *p_local;
  
  if (p->nPendingData != 0) {
    p->nPendingData = 0;
    fts5FlushOneHash(p);
  }
  return;
}

Assistant:

static void fts5IndexFlush(Fts5Index *p){
  /* Unless it is empty, flush the hash table to disk */
  if( p->nPendingData ){
    assert( p->pHash );
    p->nPendingData = 0;
    fts5FlushOneHash(p);
  }
}